

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void __thiscall VCCLCompilerTool::VCCLCompilerTool(VCCLCompilerTool *this)

{
  QString *in_RDI;
  char *in_stack_00000028;
  QString *this_00;
  
  this_00 = in_RDI;
  VCToolBase::VCToolBase((VCToolBase *)in_RDI);
  (in_RDI->d).d = (Data *)&PTR__VCCLCompilerTool_003bab08;
  QList<QString>::QList((QList<QString> *)0x26afc8);
  QList<QString>::QList((QList<QString> *)0x26afd6);
  QList<QString>::QList((QList<QString> *)0x26afe4);
  QString::QString((QString *)0x26aff2);
  *(undefined4 *)&in_RDI[4].d.ptr = 0;
  *(undefined4 *)((long)&in_RDI[4].d.ptr + 4) = 0;
  *(undefined4 *)&in_RDI[4].d.size = 0;
  QString::QString((QString *)0x26b015);
  *(undefined4 *)&in_RDI[6].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[6].d.d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[6].d.ptr = 0;
  *(undefined4 *)((long)&in_RDI[6].d.ptr + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[6].d.size = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[6].d.size + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[7].d.d = 0;
  *(undefined4 *)&in_RDI[7].d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[7].d.ptr + 4) = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26b080);
  *(undefined4 *)&in_RDI[8].d.size = 0;
  *(undefined4 *)((long)&in_RDI[8].d.size + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[9].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[9].d.d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[9].d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[9].d.ptr + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[9].d.size = 0;
  *(undefined4 *)((long)&in_RDI[9].d.size + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[10].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[10].d.d + 4) = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26b0f5);
  QList<QString>::QList((QList<QString> *)0x26b106);
  *(undefined4 *)&in_RDI[0xc].d.ptr = 0;
  *(undefined4 *)((long)&in_RDI[0xc].d.ptr + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0xc].d.size = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xc].d.size + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0xd].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0xd].d.d + 4) = 3;
  *(undefined4 *)&in_RDI[0xd].d.ptr = 0xffffffff;
  QString::QString((QString *)0x26b15d);
  QString::QString((QString *)0x26b16e);
  *(undefined4 *)&in_RDI[0xf].d.size = 0xffffffff;
  QString::QString((QString *)0x26b189);
  *(undefined4 *)&in_RDI[0x11].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x11].d.d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x11].d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x11].d.ptr + 4) = 4;
  *(undefined4 *)&in_RDI[0x11].d.size = 0;
  *(undefined4 *)((long)&in_RDI[0x11].d.size + 4) = 0xffffffff;
  QString::QString((QString *)0x26b1d6);
  QString::QString((QString *)0x26b1e7);
  QString::QString((QString *)0x26b1f8);
  QList<QString>::QList((QList<QString> *)0x26b209);
  QString::QString(this_00,in_stack_00000028);
  *(undefined4 *)&in_RDI[0x17].d.d = 0;
  *(undefined4 *)((long)&in_RDI[0x17].d.d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x17].d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x17].d.ptr + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x17].d.size = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x17].d.size + 4) = 0;
  *(undefined4 *)&in_RDI[0x18].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x18].d.d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x18].d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x18].d.ptr + 4) = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26b296);
  *(undefined4 *)&in_RDI[0x19].d.size = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x19].d.size + 4) = 0xffffffff;
  QList<QString>::QList((QList<QString> *)0x26b2bb);
  *(undefined4 *)&in_RDI[0x1b].d.d = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x1b].d.d + 4) = 0;
  *(undefined4 *)&in_RDI[0x1b].d.ptr = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x1b].d.ptr + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x1b].d.size = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[0x1b].d.size + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[0x1c].d.d = 0;
  *(undefined4 *)((long)&in_RDI[0x1c].d.d + 4) = 0xffffffff;
  QString::QString((QString *)0x26b31c);
  *(undefined4 *)&in_RDI[0x1d].d.ptr = 0xffffffff;
  QString::QString((QString *)0x26b337);
  QString::QString((QString *)0x26b348);
  *(undefined4 *)&in_RDI[0x1f].d.size = 0xffffffff;
  QString::QString((QString *)0x26b363);
  return;
}

Assistant:

VCCLCompilerTool::VCCLCompilerTool()
    :        AssemblerOutput(asmListingNone),
        BasicRuntimeChecks(runtimeBasicCheckNone),
        BrowseInformation(brInfoNone),
        BufferSecurityCheck(unset),
        CallingConvention(callConventionDefault),
        CompileAs(compileAsDefault),
        CompileAsManaged(managedDefault),
        CompileAsWinRT(unset),
        CompileOnly(unset),
        DebugInformationFormat(debugDisabled),
        Detect64BitPortabilityProblems(unset),
        DisableLanguageExtensions(unset),
        EnableEnhancedInstructionSet(archNotSet),
        EnableFiberSafeOptimizations(unset),
        EnableFunctionLevelLinking(unset),
        EnableIntrinsicFunctions(unset),
        ExceptionHandling(ehDefault),
        ExpandAttributedSource(unset),
        FavorSizeOrSpeed(favorNone),
        FloatingPointModel(floatingPointNotSet),
        FloatingPointExceptions(unset),
        ForceConformanceInForLoopScope(unset),
        GeneratePreprocessedFile(preprocessNo),
        PreprocessSuppressLineNumbers(unset),
        GlobalOptimizations(unset),
        IgnoreStandardIncludePath(unset),
        ImproveFloatingPointConsistency(unset),
        InlineFunctionExpansion(expandDefault),
        KeepComments(unset),
        MinimalRebuild(unset),
        OmitDefaultLibName(unset),
        OmitFramePointers(unset),
        OpenMP(unset),
        Optimization(optimizeCustom),
        OptimizeForProcessor(procOptimizeBlended),
        OptimizeForWindowsApplication(unset),
        ProgramDataBaseFileName(""),
        RuntimeLibrary(rtMultiThreaded),
        RuntimeTypeInfo(unset),
        ShowIncludes(unset),
        SmallerTypeCheck(unset),
        StringPooling(unset),
        StructMemberAlignment(alignNotSet),
        SuppressStartupBanner(unset),
        TreatWChar_tAsBuiltInType(unset),
        TurnOffAssemblyGeneration(unset),
        UndefineAllPreprocessorDefinitions(unset),
        UsePrecompiledHeader(pchUnset),
        UseUnicodeForAssemblerListing(unset),
        WarnAsError(unset),
        WarningLevel(warningLevel_0),
        WholeProgramOptimization(unset),
        CompileForArchitecture(archUnknown),
        InterworkCalls(unset),
        EnablePREfast(unset),
        DisplayFullPaths(_False),
        MultiProcessorCompilation(unset),
        GenerateXMLDocumentationFiles(unset),
        CreateHotpatchableImage(unset)
{
}